

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O3

void __thiscall StringBuffer::appendChar(StringBuffer *this,char c)

{
  ulong uVar1;
  unsigned_long uVar2;
  char *__ptr;
  ulong uVar3;
  
  uVar1 = this->saLength;
  __ptr = this->sData;
  uVar3 = this->sLength;
  if (uVar1 == uVar3) {
    uVar3 = uVar1 >> 3;
    if ((long)(uVar1 >> 3) < sbDefaultBoost) {
      uVar3 = sbDefaultBoost;
    }
    this->saLength = uVar3 + uVar1;
    __ptr = (char *)realloc(__ptr,uVar3 + uVar1 + 1);
    this->sData = __ptr;
    uVar3 = this->sLength;
  }
  __ptr[uVar3] = c;
  uVar2 = this->sLength;
  this->sLength = uVar2 + 1;
  this->sData[uVar2 + 1] = '\0';
  return;
}

Assistant:

void StringBuffer::appendChar(const char c) {
  long addThis;
  if (saLength == sLength) {
    addThis = saLength / 8;
    if (StringBuffer::sbDefaultBoost > addThis)
      addThis = StringBuffer::sbDefaultBoost;
    saLength += addThis;
    sData = (char *)realloc(sData, sizeof(char) * (saLength + 1));
  }
  sData[sLength] = c;
  sData[++sLength] = 0;
}